

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  int iVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  ulong *puVar58;
  AABBNodeMB4D *node1;
  ulong uVar59;
  long lVar60;
  long lVar61;
  uint uVar62;
  long lVar63;
  long lVar64;
  ulong uVar65;
  undefined4 uVar66;
  undefined1 (*pauVar67) [16];
  long lVar68;
  Geometry *pGVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar84;
  float fVar86;
  float fVar89;
  float fVar90;
  float fVar92;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar87;
  undefined1 auVar82 [32];
  float fVar85;
  float fVar88;
  float fVar91;
  undefined1 auVar83 [32];
  float fVar93;
  float fVar102;
  vint4 ai_5;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar106;
  float fVar123;
  float fVar124;
  vint4 ai;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar125;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  undefined1 auVar139 [32];
  float fVar142;
  float fVar156;
  float fVar157;
  vint4 ai_1;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar158;
  float fVar160;
  undefined1 auVar152 [16];
  float fVar161;
  float fVar163;
  float fVar165;
  undefined1 auVar153 [32];
  float fVar159;
  undefined1 auVar154 [32];
  float fVar162;
  float fVar164;
  float fVar166;
  float fVar167;
  undefined1 auVar155 [32];
  vint4 bi_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  float fVar178;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  float fVar194;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar192;
  float fVar193;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar209;
  undefined1 auVar208 [64];
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar216 [64];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  float fVar225;
  float fVar226;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar227 [64];
  float fVar240;
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar242 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  float fVar252;
  float fVar253;
  undefined1 auVar254 [32];
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar255 [64];
  float fVar268;
  undefined1 auVar269 [32];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar270 [64];
  vint4 bi_5;
  float old_t;
  vint4 bi_2;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  NodeRef stack [244];
  undefined1 local_ec1;
  ulong *local_ec0;
  size_t local_eb8;
  RayK<8> *local_eb0;
  uint local_ea8;
  uint local_ea4;
  undefined8 local_ea0;
  float fStack_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float fStack_e88;
  float fStack_e84;
  ulong local_e68;
  undefined8 local_e60;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined1 local_e30 [16];
  undefined1 local_e20 [32];
  undefined1 local_e00 [32];
  undefined1 (*local_dc8) [16];
  undefined1 (*local_dc0) [16];
  long local_db8;
  ulong local_db0;
  ulong local_da8;
  long local_da0;
  long local_d98;
  ulong *local_d90;
  ulong local_d88;
  long local_d80;
  long local_d78;
  Scene *local_d70;
  ulong local_d68;
  Geometry *local_d60;
  undefined1 auStack_d58 [24];
  undefined1 local_d40 [32];
  undefined1 local_d20 [16];
  undefined1 local_d10 [16];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [8];
  float fStack_cd8;
  float fStack_cd4;
  undefined1 local_cd0 [16];
  undefined1 local_cc0 [16];
  undefined1 local_cb0 [16];
  undefined1 local_ca0 [16];
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [32];
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  float local_940 [4];
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar66 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_bb0._4_4_ = uVar66;
  local_bb0._0_4_ = uVar66;
  local_bb0._8_4_ = uVar66;
  local_bb0._12_4_ = uVar66;
  auVar242 = ZEXT1664(local_bb0);
  uVar66 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_bc0._4_4_ = uVar66;
  local_bc0._0_4_ = uVar66;
  local_bc0._8_4_ = uVar66;
  local_bc0._12_4_ = uVar66;
  auVar251 = ZEXT1664(local_bc0);
  uVar66 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_bd0._4_4_ = uVar66;
  local_bd0._0_4_ = uVar66;
  local_bd0._8_4_ = uVar66;
  local_bd0._12_4_ = uVar66;
  auVar255 = ZEXT1664(local_bd0);
  fVar106 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar77 = ZEXT416((uint)(fVar106 * 0.99999964));
  local_be0 = vshufps_avx(auVar77,auVar77,0);
  auVar270 = ZEXT1664(local_be0);
  auVar77 = ZEXT416((uint)(fVar85 * 0.99999964));
  _local_ce0 = vshufps_avx(auVar77,auVar77,0);
  auVar177 = ZEXT1664(_local_ce0);
  auVar77 = ZEXT416((uint)(fVar86 * 0.99999964));
  local_ca0 = vshufps_avx(auVar77,auVar77,0);
  auVar191 = ZEXT1664(local_ca0);
  auVar77 = ZEXT416((uint)(fVar106 * 1.0000004));
  local_bf0 = vshufps_avx(auVar77,auVar77,0);
  auVar204 = ZEXT1664(local_bf0);
  auVar77 = ZEXT416((uint)(fVar85 * 1.0000004));
  local_cb0 = vshufps_avx(auVar77,auVar77,0);
  auVar208 = ZEXT1664(local_cb0);
  auVar77 = ZEXT416((uint)(fVar86 * 1.0000004));
  local_cc0 = vshufps_avx(auVar77,auVar77,0);
  auVar224 = ZEXT1664(local_cc0);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_d68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar65 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar74 = uVar71 ^ 0x10;
  uVar72 = local_d68 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  local_cd0._4_4_ = iVar3;
  local_cd0._0_4_ = iVar3;
  local_cd0._8_4_ = iVar3;
  local_cd0._12_4_ = iVar3;
  auVar227 = ZEXT1664(local_cd0);
  iVar3 = (tray->tfar).field_0.i[k];
  local_e30._4_4_ = iVar3;
  local_e30._0_4_ = iVar3;
  local_e30._8_4_ = iVar3;
  local_e30._12_4_ = iVar3;
  auVar216 = ZEXT1664(local_e30);
  uVar62 = 1 << ((byte)k & 0x1f);
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  pauVar67 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar62 & 0xf) << 4));
  local_dc8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar62 >> 4) * 0x10);
  auVar116._8_4_ = 0x3f800000;
  auVar116._0_8_ = 0x3f8000003f800000;
  auVar116._12_4_ = 0x3f800000;
  auVar116._16_4_ = 0x3f800000;
  auVar116._20_4_ = 0x3f800000;
  auVar116._24_4_ = 0x3f800000;
  auVar116._28_4_ = 0x3f800000;
  auVar80._8_4_ = 0xbf800000;
  auVar80._0_8_ = 0xbf800000bf800000;
  auVar80._12_4_ = 0xbf800000;
  auVar80._16_4_ = 0xbf800000;
  auVar80._20_4_ = 0xbf800000;
  auVar80._24_4_ = 0xbf800000;
  auVar80._28_4_ = 0xbf800000;
  _local_b80 = vblendvps_avx(auVar116,auVar80,local_b60);
  puVar58 = local_7f8;
  local_eb8 = k;
  local_eb0 = ray;
  local_dc0 = pauVar67;
  local_da8 = uVar71;
LAB_00fa67c6:
  do {
    local_d90 = puVar58;
    if (local_d90 == &local_800) {
LAB_00fa7a81:
      return local_d90 != &local_800;
    }
    local_ec0 = local_d90 + -1;
    uVar73 = local_d90[-1];
    while ((uVar73 & 8) == 0) {
      uVar59 = uVar73 & 0xfffffffffffffff0;
      fVar106 = *(float *)(ray + k * 4 + 0xe0);
      auVar76._4_4_ = fVar106;
      auVar76._0_4_ = fVar106;
      auVar76._8_4_ = fVar106;
      auVar76._12_4_ = fVar106;
      pfVar2 = (float *)(uVar59 + 0x80 + uVar71);
      pfVar1 = (float *)(uVar59 + 0x20 + uVar71);
      auVar77._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar77._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar77._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar77._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar77 = vsubps_avx(auVar77,auVar242._0_16_);
      auVar94._0_4_ = auVar270._0_4_ * auVar77._0_4_;
      auVar94._4_4_ = auVar270._4_4_ * auVar77._4_4_;
      auVar94._8_4_ = auVar270._8_4_ * auVar77._8_4_;
      auVar94._12_4_ = auVar270._12_4_ * auVar77._12_4_;
      pfVar2 = (float *)(uVar59 + 0x80 + local_d68);
      pfVar1 = (float *)(uVar59 + 0x20 + local_d68);
      auVar107._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar107._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar107._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar107._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar77 = vsubps_avx(auVar107,auVar251._0_16_);
      auVar108._0_4_ = auVar177._0_4_ * auVar77._0_4_;
      auVar108._4_4_ = auVar177._4_4_ * auVar77._4_4_;
      auVar108._8_4_ = auVar177._8_4_ * auVar77._8_4_;
      auVar108._12_4_ = auVar177._12_4_ * auVar77._12_4_;
      pfVar2 = (float *)(uVar59 + 0x80 + uVar65);
      pfVar1 = (float *)(uVar59 + 0x20 + uVar65);
      auVar129._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar129._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar129._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar129._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar77 = vsubps_avx(auVar129,auVar255._0_16_);
      auVar130._0_4_ = auVar191._0_4_ * auVar77._0_4_;
      auVar130._4_4_ = auVar191._4_4_ * auVar77._4_4_;
      auVar130._8_4_ = auVar191._8_4_ * auVar77._8_4_;
      auVar130._12_4_ = auVar191._12_4_ * auVar77._12_4_;
      auVar77 = vmaxps_avx(auVar108,auVar130);
      auVar94 = vmaxps_avx(auVar227._0_16_,auVar94);
      pfVar2 = (float *)(uVar59 + 0x80 + uVar74);
      pfVar1 = (float *)(uVar59 + 0x20 + uVar74);
      auVar131._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar131._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar131._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar131._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar77 = vmaxps_avx(auVar94,auVar77);
      auVar94 = vsubps_avx(auVar131,auVar242._0_16_);
      pfVar2 = (float *)(uVar59 + 0x80 + uVar72);
      auVar109._0_4_ = auVar204._0_4_ * auVar94._0_4_;
      auVar109._4_4_ = auVar204._4_4_ * auVar94._4_4_;
      auVar109._8_4_ = auVar204._8_4_ * auVar94._8_4_;
      auVar109._12_4_ = auVar204._12_4_ * auVar94._12_4_;
      pfVar1 = (float *)(uVar59 + 0x20 + uVar72);
      auVar132._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar132._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar132._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar132._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar94 = vsubps_avx(auVar132,auVar251._0_16_);
      pfVar2 = (float *)(uVar59 + 0x80 + (uVar65 ^ 0x10));
      pfVar1 = (float *)(uVar59 + 0x20 + (uVar65 ^ 0x10));
      auVar143._0_4_ = fVar106 * *pfVar2 + *pfVar1;
      auVar143._4_4_ = fVar106 * pfVar2[1] + pfVar1[1];
      auVar143._8_4_ = fVar106 * pfVar2[2] + pfVar1[2];
      auVar143._12_4_ = fVar106 * pfVar2[3] + pfVar1[3];
      auVar133._0_4_ = auVar208._0_4_ * auVar94._0_4_;
      auVar133._4_4_ = auVar208._4_4_ * auVar94._4_4_;
      auVar133._8_4_ = auVar208._8_4_ * auVar94._8_4_;
      auVar133._12_4_ = auVar208._12_4_ * auVar94._12_4_;
      auVar94 = vsubps_avx(auVar143,auVar255._0_16_);
      auVar144._0_4_ = auVar224._0_4_ * auVar94._0_4_;
      auVar144._4_4_ = auVar224._4_4_ * auVar94._4_4_;
      auVar144._8_4_ = auVar224._8_4_ * auVar94._8_4_;
      auVar144._12_4_ = auVar224._12_4_ * auVar94._12_4_;
      auVar94 = vminps_avx(auVar133,auVar144);
      auVar107 = vminps_avx(auVar216._0_16_,auVar109);
      auVar94 = vminps_avx(auVar107,auVar94);
      if (((uint)uVar73 & 7) == 6) {
        auVar94 = vcmpps_avx(auVar77,auVar94,2);
        auVar77 = vcmpps_avx(*(undefined1 (*) [16])(uVar59 + 0xe0),auVar76,2);
        auVar107 = vcmpps_avx(auVar76,*(undefined1 (*) [16])(uVar59 + 0xf0),1);
        auVar77 = vandps_avx(auVar77,auVar107);
        auVar77 = vandps_avx(auVar77,auVar94);
      }
      else {
        auVar77 = vcmpps_avx(auVar77,auVar94,2);
      }
      auVar77 = vpslld_avx(auVar77,0x1f);
      uVar62 = vmovmskps_avx(auVar77);
      puVar58 = local_ec0;
      if (uVar62 == 0) goto LAB_00fa67c6;
      pauVar67 = (undefined1 (*) [16])0x0;
      if ((byte)uVar62 != 0) {
        for (; ((byte)uVar62 >> (long)pauVar67 & 1) == 0;
            pauVar67 = (undefined1 (*) [16])(*pauVar67 + 1)) {
        }
      }
      uVar73 = *(ulong *)(uVar59 + (long)pauVar67 * 8);
      uVar62 = (uVar62 & 0xff) - 1 & uVar62 & 0xff;
      uVar70 = (ulong)uVar62;
      if (uVar62 != 0) {
        do {
          *local_ec0 = uVar73;
          local_ec0 = local_ec0 + 1;
          pauVar67 = (undefined1 (*) [16])0x0;
          if (uVar70 != 0) {
            for (; (uVar70 >> (long)pauVar67 & 1) == 0;
                pauVar67 = (undefined1 (*) [16])(*pauVar67 + 1)) {
            }
          }
          uVar73 = *(ulong *)(uVar59 + (long)pauVar67 * 8);
          uVar70 = uVar70 - 1 & uVar70;
        } while (uVar70 != 0);
      }
    }
    local_db8 = (ulong)((uint)uVar73 & 0xf) - 8;
    uVar73 = uVar73 & 0xfffffffffffffff0;
    for (local_d98 = 0; puVar58 = local_ec0, local_d98 != local_db8; local_d98 = local_d98 + 1) {
      local_da0 = local_d98 * 0x90;
      uVar59 = *(ulong *)(uVar73 + 0x20 + local_da0);
      auVar110._8_8_ = 0;
      auVar110._0_8_ = uVar59;
      auVar134._8_8_ = 0;
      auVar134._0_8_ = *(ulong *)(uVar73 + 0x24 + local_da0);
      auVar77 = vpminub_avx(auVar110,auVar134);
      auVar94 = vpcmpeqb_avx(auVar110,auVar77);
      auVar111._8_8_ = 0;
      auVar111._0_8_ = uVar59;
      auVar77 = vpmovzxbd_avx(auVar111);
      auVar77 = vcvtdq2ps_avx(auVar77);
      fVar106 = *(float *)(uVar73 + 0x44 + local_da0);
      fVar85 = *(float *)(uVar73 + 0x38 + local_da0);
      auVar112._0_4_ = fVar106 * auVar77._0_4_ + fVar85;
      auVar112._4_4_ = fVar106 * auVar77._4_4_ + fVar85;
      auVar112._8_4_ = fVar106 * auVar77._8_4_ + fVar85;
      auVar112._12_4_ = fVar106 * auVar77._12_4_ + fVar85;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = *(ulong *)(uVar73 + 0x50 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar179);
      auVar77 = vcvtdq2ps_avx(auVar77);
      fVar86 = *(float *)(uVar73 + 0x74 + local_da0);
      fVar88 = *(float *)(uVar73 + 0x68 + local_da0);
      auVar180._0_4_ = fVar88 + fVar86 * auVar77._0_4_;
      auVar180._4_4_ = fVar88 + fVar86 * auVar77._4_4_;
      auVar180._8_4_ = fVar88 + fVar86 * auVar77._8_4_;
      auVar180._12_4_ = fVar88 + fVar86 * auVar77._12_4_;
      auVar77 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                               *(float *)(uVar73 + 0x80 + local_da0)) *
                              *(float *)(uVar73 + 0x84 + local_da0)));
      auVar77 = vshufps_avx(auVar77,auVar77,0);
      auVar107 = vsubps_avx(auVar180,auVar112);
      fVar89 = auVar77._0_4_;
      fVar91 = auVar77._4_4_;
      fVar92 = auVar77._8_4_;
      fVar158 = auVar77._12_4_;
      auVar113._0_4_ = auVar112._0_4_ + fVar89 * auVar107._0_4_;
      auVar113._4_4_ = auVar112._4_4_ + fVar91 * auVar107._4_4_;
      auVar113._8_4_ = auVar112._8_4_ + fVar92 * auVar107._8_4_;
      auVar113._12_4_ = auVar112._12_4_ + fVar158 * auVar107._12_4_;
      auVar77 = vpmovzxbd_avx(auVar134);
      auVar77 = vcvtdq2ps_avx(auVar77);
      auVar135._0_4_ = fVar85 + fVar106 * auVar77._0_4_;
      auVar135._4_4_ = fVar85 + fVar106 * auVar77._4_4_;
      auVar135._8_4_ = fVar85 + fVar106 * auVar77._8_4_;
      auVar135._12_4_ = fVar85 + fVar106 * auVar77._12_4_;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = *(ulong *)(uVar73 + 0x54 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar145);
      auVar77 = vcvtdq2ps_avx(auVar77);
      auVar146._0_4_ = fVar88 + fVar86 * auVar77._0_4_;
      auVar146._4_4_ = fVar88 + fVar86 * auVar77._4_4_;
      auVar146._8_4_ = fVar88 + fVar86 * auVar77._8_4_;
      auVar146._12_4_ = fVar88 + fVar86 * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar146,auVar135);
      auVar136._0_4_ = auVar135._0_4_ + fVar89 * auVar77._0_4_;
      auVar136._4_4_ = auVar135._4_4_ + fVar91 * auVar77._4_4_;
      auVar136._8_4_ = auVar135._8_4_ + fVar92 * auVar77._8_4_;
      auVar136._12_4_ = auVar135._12_4_ + fVar158 * auVar77._12_4_;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = *(ulong *)(uVar73 + 0x28 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar147);
      auVar77 = vcvtdq2ps_avx(auVar77);
      fVar106 = *(float *)(uVar73 + 0x48 + local_da0);
      fVar85 = *(float *)(uVar73 + 0x3c + local_da0);
      auVar148._0_4_ = fVar85 + fVar106 * auVar77._0_4_;
      auVar148._4_4_ = fVar85 + fVar106 * auVar77._4_4_;
      auVar148._8_4_ = fVar85 + fVar106 * auVar77._8_4_;
      auVar148._12_4_ = fVar85 + fVar106 * auVar77._12_4_;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = *(ulong *)(uVar73 + 0x58 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar198);
      auVar77 = vcvtdq2ps_avx(auVar77);
      fVar86 = *(float *)(uVar73 + 0x78 + local_da0);
      fVar88 = *(float *)(uVar73 + 0x6c + local_da0);
      auVar199._0_4_ = fVar88 + fVar86 * auVar77._0_4_;
      auVar199._4_4_ = fVar88 + fVar86 * auVar77._4_4_;
      auVar199._8_4_ = fVar88 + fVar86 * auVar77._8_4_;
      auVar199._12_4_ = fVar88 + fVar86 * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar199,auVar148);
      auVar149._0_4_ = auVar148._0_4_ + fVar89 * auVar77._0_4_;
      auVar149._4_4_ = auVar148._4_4_ + fVar91 * auVar77._4_4_;
      auVar149._8_4_ = auVar148._8_4_ + fVar92 * auVar77._8_4_;
      auVar149._12_4_ = auVar148._12_4_ + fVar158 * auVar77._12_4_;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = *(ulong *)(uVar73 + 0x2c + local_da0);
      auVar77 = vpmovzxbd_avx(auVar200);
      auVar77 = vcvtdq2ps_avx(auVar77);
      auVar168._0_4_ = fVar85 + fVar106 * auVar77._0_4_;
      auVar168._4_4_ = fVar85 + fVar106 * auVar77._4_4_;
      auVar168._8_4_ = fVar85 + fVar106 * auVar77._8_4_;
      auVar168._12_4_ = fVar85 + fVar106 * auVar77._12_4_;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = *(ulong *)(uVar73 + 0x5c + local_da0);
      auVar77 = vpmovzxbd_avx(auVar181);
      auVar77 = vcvtdq2ps_avx(auVar77);
      auVar182._0_4_ = fVar88 + fVar86 * auVar77._0_4_;
      auVar182._4_4_ = fVar88 + fVar86 * auVar77._4_4_;
      auVar182._8_4_ = fVar88 + fVar86 * auVar77._8_4_;
      auVar182._12_4_ = fVar88 + fVar86 * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar182,auVar168);
      auVar169._0_4_ = auVar168._0_4_ + fVar89 * auVar77._0_4_;
      auVar169._4_4_ = auVar168._4_4_ + fVar91 * auVar77._4_4_;
      auVar169._8_4_ = auVar168._8_4_ + fVar92 * auVar77._8_4_;
      auVar169._12_4_ = auVar168._12_4_ + fVar158 * auVar77._12_4_;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = *(ulong *)(uVar73 + 0x30 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar183);
      auVar77 = vcvtdq2ps_avx(auVar77);
      fVar106 = *(float *)(uVar73 + 0x4c + local_da0);
      fVar85 = *(float *)(uVar73 + 0x40 + local_da0);
      auVar184._0_4_ = fVar85 + fVar106 * auVar77._0_4_;
      auVar184._4_4_ = fVar85 + fVar106 * auVar77._4_4_;
      auVar184._8_4_ = fVar85 + fVar106 * auVar77._8_4_;
      auVar184._12_4_ = fVar85 + fVar106 * auVar77._12_4_;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = *(ulong *)(uVar73 + 0x60 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar211);
      auVar77 = vcvtdq2ps_avx(auVar77);
      fVar86 = *(float *)(uVar73 + 0x7c + local_da0);
      fVar88 = *(float *)(uVar73 + 0x70 + local_da0);
      auVar212._0_4_ = fVar88 + fVar86 * auVar77._0_4_;
      auVar212._4_4_ = fVar88 + fVar86 * auVar77._4_4_;
      auVar212._8_4_ = fVar88 + fVar86 * auVar77._8_4_;
      auVar212._12_4_ = fVar88 + fVar86 * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar212,auVar184);
      auVar185._0_4_ = auVar77._0_4_ * fVar89 + auVar184._0_4_;
      auVar185._4_4_ = auVar77._4_4_ * fVar91 + auVar184._4_4_;
      auVar185._8_4_ = auVar77._8_4_ * fVar92 + auVar184._8_4_;
      auVar185._12_4_ = auVar77._12_4_ * fVar158 + auVar184._12_4_;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = *(ulong *)(uVar73 + 0x34 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar213);
      auVar77 = vcvtdq2ps_avx(auVar77);
      auVar216 = ZEXT1664(local_e30);
      auVar201._0_4_ = fVar85 + auVar77._0_4_ * fVar106;
      auVar201._4_4_ = fVar85 + auVar77._4_4_ * fVar106;
      auVar201._8_4_ = fVar85 + auVar77._8_4_ * fVar106;
      auVar201._12_4_ = fVar85 + auVar77._12_4_ * fVar106;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = *(ulong *)(uVar73 + 100 + local_da0);
      auVar77 = vpmovzxbd_avx(auVar205);
      auVar77 = vcvtdq2ps_avx(auVar77);
      auVar206._0_4_ = fVar88 + fVar86 * auVar77._0_4_;
      auVar206._4_4_ = fVar88 + fVar86 * auVar77._4_4_;
      auVar206._8_4_ = fVar88 + fVar86 * auVar77._8_4_;
      auVar206._12_4_ = fVar88 + fVar86 * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar206,auVar201);
      auVar95._0_4_ = auVar201._0_4_ + auVar77._0_4_ * fVar89;
      auVar95._4_4_ = auVar201._4_4_ + auVar77._4_4_ * fVar91;
      auVar95._8_4_ = auVar201._8_4_ + auVar77._8_4_ * fVar92;
      auVar95._12_4_ = auVar201._12_4_ + auVar77._12_4_ * fVar158;
      auVar77 = vsubps_avx(auVar113,auVar242._0_16_);
      auVar114._0_4_ = auVar270._0_4_ * auVar77._0_4_;
      auVar114._4_4_ = auVar270._4_4_ * auVar77._4_4_;
      auVar114._8_4_ = auVar270._8_4_ * auVar77._8_4_;
      auVar114._12_4_ = auVar270._12_4_ * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar149,auVar251._0_16_);
      auVar150._0_4_ = auVar77._0_4_ * (float)local_ce0._0_4_;
      auVar150._4_4_ = auVar77._4_4_ * (float)local_ce0._4_4_;
      auVar150._8_4_ = auVar77._8_4_ * fStack_cd8;
      auVar150._12_4_ = auVar77._12_4_ * fStack_cd4;
      auVar77 = vsubps_avx(auVar136,auVar242._0_16_);
      auVar137._0_4_ = auVar204._0_4_ * auVar77._0_4_;
      auVar137._4_4_ = auVar204._4_4_ * auVar77._4_4_;
      auVar137._8_4_ = auVar204._8_4_ * auVar77._8_4_;
      auVar137._12_4_ = auVar204._12_4_ * auVar77._12_4_;
      auVar77 = vsubps_avx(auVar169,auVar251._0_16_);
      auVar170._0_4_ = local_cb0._0_4_ * auVar77._0_4_;
      auVar170._4_4_ = local_cb0._4_4_ * auVar77._4_4_;
      auVar170._8_4_ = local_cb0._8_4_ * auVar77._8_4_;
      auVar170._12_4_ = local_cb0._12_4_ * auVar77._12_4_;
      auVar107 = vpminsd_avx(auVar114,auVar137);
      auVar77 = vpmaxsd_avx(auVar114,auVar137);
      auVar76 = vpminsd_avx(auVar150,auVar170);
      auVar107 = vpmaxsd_avx(auVar107,auVar76);
      auVar76 = vpmaxsd_avx(auVar150,auVar170);
      auVar108 = vsubps_avx(auVar185,auVar255._0_16_);
      auVar171._0_4_ = local_ca0._0_4_ * auVar108._0_4_;
      auVar171._4_4_ = local_ca0._4_4_ * auVar108._4_4_;
      auVar171._8_4_ = local_ca0._8_4_ * auVar108._8_4_;
      auVar171._12_4_ = local_ca0._12_4_ * auVar108._12_4_;
      auVar108 = vsubps_avx(auVar95,auVar255._0_16_);
      auVar96._0_4_ = local_cc0._0_4_ * auVar108._0_4_;
      auVar96._4_4_ = local_cc0._4_4_ * auVar108._4_4_;
      auVar96._8_4_ = local_cc0._8_4_ * auVar108._8_4_;
      auVar96._12_4_ = local_cc0._12_4_ * auVar108._12_4_;
      auVar108 = vpminsd_avx(auVar77,auVar76);
      auVar76 = vpminsd_avx(auVar171,auVar96);
      auVar77 = vpmaxsd_avx(auVar171,auVar96);
      auVar76 = vpmaxsd_avx(auVar76,local_cd0);
      auVar107 = vpmaxsd_avx(auVar107,auVar76);
      auVar77 = vpminsd_avx(auVar77,local_e30);
      auVar77 = vpminsd_avx(auVar108,auVar77);
      auVar77 = vpcmpgtd_avx(auVar107,auVar77);
      local_ea0._0_4_ = auVar94._0_4_;
      auVar94 = vpmovsxbd_avx(ZEXT416((uint)local_ea0));
      auVar77 = vpandn_avx(auVar77,auVar94);
      uVar66 = vmovmskps_avx(auVar77);
      local_d88 = CONCAT44((int)((ulong)pauVar67 >> 0x20),uVar66);
      local_da0 = uVar73 + local_da0;
      while( true ) {
        auVar227 = ZEXT1664(local_cd0);
        auVar224 = ZEXT1664(local_cc0);
        auVar208 = ZEXT1664(local_cb0);
        auVar191 = ZEXT1664(local_ca0);
        if (local_d88 == 0) break;
        lVar12 = 0;
        if (local_d88 != 0) {
          for (; (local_d88 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar4 = *(ushort *)(local_da0 + lVar12 * 8);
        uVar5 = *(ushort *)(local_da0 + 2 + lVar12 * 8);
        uVar62 = *(uint *)(local_da0 + 0x88);
        local_e68 = (ulong)uVar62;
        uVar6 = *(uint *)(local_da0 + 4 + lVar12 * 8);
        local_db0 = (ulong)uVar6;
        local_d70 = context->scene;
        pGVar69 = (local_d70->geometries).items[local_e68].ptr;
        local_d78 = *(long *)&pGVar69->field_0x58;
        local_d80 = pGVar69[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                    local_db0;
        auVar78._8_8_ = 0;
        auVar78._0_4_ = (pGVar69->time_range).lower;
        auVar78._4_4_ = (pGVar69->time_range).upper;
        auVar77 = vshufps_avx(auVar78,auVar78,0);
        auVar117._16_16_ = auVar77;
        auVar117._0_16_ = auVar77;
        auVar80 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar117);
        auVar94 = vshufps_avx(auVar78,auVar78,0x55);
        auVar77 = vsubps_avx(auVar94,auVar77);
        auVar81._16_16_ = auVar77;
        auVar81._0_16_ = auVar77;
        auVar80 = vdivps_avx(auVar80,auVar81);
        fVar106 = pGVar69->fnumTimeSegments;
        auVar21._4_4_ = fVar106 * auVar80._4_4_;
        auVar21._0_4_ = fVar106 * auVar80._0_4_;
        auVar21._8_4_ = fVar106 * auVar80._8_4_;
        auVar21._12_4_ = fVar106 * auVar80._12_4_;
        auVar21._16_4_ = fVar106 * auVar80._16_4_;
        auVar21._20_4_ = fVar106 * auVar80._20_4_;
        auVar21._24_4_ = fVar106 * auVar80._24_4_;
        auVar21._28_4_ = auVar80._28_4_;
        auVar80 = vroundps_avx(auVar21,1);
        auVar77 = vshufps_avx(ZEXT416((uint)(fVar106 + -1.0)),ZEXT416((uint)(fVar106 + -1.0)),0);
        auVar98._16_16_ = auVar77;
        auVar98._0_16_ = auVar77;
        auVar80 = vminps_avx(auVar80,auVar98);
        auVar80 = vmaxps_avx(auVar80,_DAT_01f7b000);
        local_aa0 = vsubps_avx(auVar21,auVar80);
        local_ac0 = vcvtps2dq_avx(auVar80);
        local_ea4 = uVar4 & 0x7fff;
        local_ea8 = uVar5 & 0x7fff;
        uVar7 = *(uint *)(local_d78 + 4 + local_d80);
        uVar59 = (ulong)uVar7;
        uVar70 = (ulong)(uVar7 * local_ea8 + *(int *)(local_d78 + local_d80) + local_ea4);
        lVar12 = *(long *)&pGVar69[2].numPrimitives;
        lVar63 = (long)*(int *)(local_ac0 + k * 4) * 0x38;
        lVar8 = *(long *)(lVar12 + 0x10 + lVar63);
        lVar9 = *(long *)(lVar12 + lVar63);
        auVar77 = *(undefined1 (*) [16])(lVar9 + lVar8 * uVar70);
        lVar10 = *(long *)(lVar12 + 0x48 + lVar63);
        auVar94 = *(undefined1 (*) [16])(lVar9 + (uVar70 + 1) * lVar8);
        lVar68 = uVar59 + uVar70;
        auVar108 = *(undefined1 (*) [16])(lVar9 + lVar68 * lVar8);
        lVar64 = uVar70 + uVar59 + 1;
        auVar107 = *(undefined1 (*) [16])(lVar9 + lVar64 * lVar8);
        uVar71 = (ulong)(-1 < (short)uVar4);
        lVar60 = uVar70 + uVar71 + 1;
        auVar76 = *(undefined1 (*) [16])(lVar9 + lVar60 * lVar8);
        lVar61 = uVar71 + lVar64;
        uVar71 = 0;
        if (-1 < (short)uVar5) {
          uVar71 = uVar59;
        }
        auVar109 = *(undefined1 (*) [16])(lVar9 + lVar61 * lVar8);
        auVar129 = *(undefined1 (*) [16])(lVar9 + (lVar68 + uVar71) * lVar8);
        auVar130 = *(undefined1 (*) [16])(lVar9 + (lVar64 + uVar71) * lVar8);
        auVar131 = *(undefined1 (*) [16])(lVar9 + lVar8 * (uVar71 + lVar61));
        lVar12 = *(long *)(lVar12 + 0x38 + lVar63);
        fVar106 = *(float *)(local_aa0 + local_eb8 * 4);
        auVar132 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * uVar70),auVar77);
        auVar115._0_4_ = fVar106 * auVar132._0_4_ + auVar77._0_4_;
        auVar115._4_4_ = fVar106 * auVar132._4_4_ + auVar77._4_4_;
        auVar115._8_4_ = fVar106 * auVar132._8_4_ + auVar77._8_4_;
        auVar115._12_4_ = fVar106 * auVar132._12_4_ + auVar77._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * (uVar70 + 1)),auVar94);
        auVar214._0_4_ = fVar106 * auVar77._0_4_ + auVar94._0_4_;
        auVar214._4_4_ = fVar106 * auVar77._4_4_ + auVar94._4_4_;
        auVar214._8_4_ = fVar106 * auVar77._8_4_ + auVar94._8_4_;
        auVar214._12_4_ = fVar106 * auVar77._12_4_ + auVar94._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * lVar68),auVar108);
        auVar79._0_4_ = fVar106 * auVar77._0_4_ + auVar108._0_4_;
        auVar79._4_4_ = fVar106 * auVar77._4_4_ + auVar108._4_4_;
        auVar79._8_4_ = fVar106 * auVar77._8_4_ + auVar108._8_4_;
        auVar79._12_4_ = fVar106 * auVar77._12_4_ + auVar108._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * lVar64),auVar107);
        auVar97._0_4_ = fVar106 * auVar77._0_4_ + auVar107._0_4_;
        auVar97._4_4_ = fVar106 * auVar77._4_4_ + auVar107._4_4_;
        auVar97._8_4_ = fVar106 * auVar77._8_4_ + auVar107._8_4_;
        auVar97._12_4_ = fVar106 * auVar77._12_4_ + auVar107._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * lVar60),auVar76);
        auVar151._0_4_ = fVar106 * auVar77._0_4_ + auVar76._0_4_;
        auVar151._4_4_ = fVar106 * auVar77._4_4_ + auVar76._4_4_;
        auVar151._8_4_ = fVar106 * auVar77._8_4_ + auVar76._8_4_;
        auVar151._12_4_ = fVar106 * auVar77._12_4_ + auVar76._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * lVar61),auVar109);
        auVar172._0_4_ = fVar106 * auVar77._0_4_ + auVar109._0_4_;
        auVar172._4_4_ = fVar106 * auVar77._4_4_ + auVar109._4_4_;
        auVar172._8_4_ = fVar106 * auVar77._8_4_ + auVar109._8_4_;
        auVar172._12_4_ = fVar106 * auVar77._12_4_ + auVar109._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * (lVar68 + uVar71)),auVar129);
        auVar138._0_4_ = auVar129._0_4_ + fVar106 * auVar77._0_4_;
        auVar138._4_4_ = auVar129._4_4_ + fVar106 * auVar77._4_4_;
        auVar138._8_4_ = auVar129._8_4_ + fVar106 * auVar77._8_4_;
        auVar138._12_4_ = auVar129._12_4_ + fVar106 * auVar77._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + lVar10 * (lVar64 + uVar71)),auVar130);
        auVar186._0_4_ = auVar130._0_4_ + fVar106 * auVar77._0_4_;
        auVar186._4_4_ = auVar130._4_4_ + fVar106 * auVar77._4_4_;
        auVar186._8_4_ = auVar130._8_4_ + fVar106 * auVar77._8_4_;
        auVar186._12_4_ = auVar130._12_4_ + fVar106 * auVar77._12_4_;
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(lVar12 + (uVar71 + lVar61) * lVar10),auVar131);
        auVar202._0_4_ = auVar131._0_4_ + fVar106 * auVar77._0_4_;
        auVar202._4_4_ = auVar131._4_4_ + fVar106 * auVar77._4_4_;
        auVar202._8_4_ = auVar131._8_4_ + fVar106 * auVar77._8_4_;
        auVar202._12_4_ = auVar131._12_4_ + fVar106 * auVar77._12_4_;
        auVar107 = vunpcklps_avx(auVar115,auVar97);
        auVar77 = vunpckhps_avx(auVar115,auVar97);
        auVar76 = vunpcklps_avx(auVar214,auVar79);
        auVar94 = vunpckhps_avx(auVar214,auVar79);
        auVar109 = vunpcklps_avx(auVar77,auVar94);
        auVar129 = vunpcklps_avx(auVar107,auVar76);
        auVar77 = vunpckhps_avx(auVar107,auVar76);
        auVar76 = vunpcklps_avx(auVar214,auVar172);
        auVar94 = vunpckhps_avx(auVar214,auVar172);
        auVar108 = vunpcklps_avx(auVar151,auVar97);
        auVar107 = vunpckhps_avx(auVar151,auVar97);
        auVar130 = vunpcklps_avx(auVar94,auVar107);
        auVar131 = vunpcklps_avx(auVar76,auVar108);
        auVar94 = vunpckhps_avx(auVar76,auVar108);
        auVar108 = vunpcklps_avx(auVar97,auVar202);
        auVar107 = vunpckhps_avx(auVar97,auVar202);
        auVar132 = vunpcklps_avx(auVar172,auVar186);
        auVar76 = vunpckhps_avx(auVar172,auVar186);
        auVar133 = vunpcklps_avx(auVar107,auVar76);
        auVar143 = vunpcklps_avx(auVar108,auVar132);
        auVar107 = vunpckhps_avx(auVar108,auVar132);
        auVar132 = vunpcklps_avx(auVar79,auVar186);
        auVar76 = vunpckhps_avx(auVar79,auVar186);
        auVar144 = vunpcklps_avx(auVar97,auVar138);
        auVar108 = vunpckhps_avx(auVar97,auVar138);
        auVar108 = vunpcklps_avx(auVar76,auVar108);
        auVar95 = vunpcklps_avx(auVar132,auVar144);
        auVar76 = vunpckhps_avx(auVar132,auVar144);
        auVar188._16_16_ = auVar143;
        auVar188._0_16_ = auVar129;
        auVar203._16_16_ = auVar107;
        auVar203._0_16_ = auVar77;
        auVar118._16_16_ = auVar133;
        auVar118._0_16_ = auVar109;
        auVar207._16_16_ = auVar131;
        auVar207._0_16_ = auVar131;
        auVar215._16_16_ = auVar94;
        auVar215._0_16_ = auVar94;
        auVar153._16_16_ = auVar130;
        auVar153._0_16_ = auVar130;
        auVar223._16_16_ = auVar95;
        auVar223._0_16_ = auVar95;
        auVar139._16_16_ = auVar76;
        auVar139._0_16_ = auVar76;
        auVar269._16_16_ = auVar108;
        auVar269._0_16_ = auVar108;
        uVar66 = *(undefined4 *)(local_eb0 + local_eb8 * 4);
        auVar241._4_4_ = uVar66;
        auVar241._0_4_ = uVar66;
        auVar241._8_4_ = uVar66;
        auVar241._12_4_ = uVar66;
        auVar241._16_4_ = uVar66;
        auVar241._20_4_ = uVar66;
        auVar241._24_4_ = uVar66;
        auVar241._28_4_ = uVar66;
        uVar66 = *(undefined4 *)(local_eb0 + local_eb8 * 4 + 0x20);
        auVar250._4_4_ = uVar66;
        auVar250._0_4_ = uVar66;
        auVar250._8_4_ = uVar66;
        auVar250._12_4_ = uVar66;
        auVar250._16_4_ = uVar66;
        auVar250._20_4_ = uVar66;
        auVar250._24_4_ = uVar66;
        auVar250._28_4_ = uVar66;
        uVar66 = *(undefined4 *)(local_eb0 + local_eb8 * 4 + 0x40);
        auVar254._4_4_ = uVar66;
        auVar254._0_4_ = uVar66;
        auVar254._8_4_ = uVar66;
        auVar254._12_4_ = uVar66;
        auVar254._16_4_ = uVar66;
        auVar254._20_4_ = uVar66;
        auVar254._24_4_ = uVar66;
        auVar254._28_4_ = uVar66;
        auVar80 = vsubps_avx(auVar188,auVar241);
        auVar21 = vsubps_avx(auVar203,auVar250);
        local_d00 = vsubps_avx(auVar118,auVar254);
        auVar116 = vsubps_avx(auVar207,auVar241);
        auVar81 = vsubps_avx(auVar215,auVar250);
        auVar98 = vsubps_avx(auVar153,auVar254);
        auVar117 = vsubps_avx(auVar223,auVar241);
        auVar118 = vsubps_avx(auVar139,auVar250);
        auVar22 = vsubps_avx(auVar269,auVar254);
        local_c20 = vsubps_avx(auVar117,auVar80);
        local_c40 = vsubps_avx(auVar118,auVar21);
        local_c60 = vsubps_avx(auVar22,local_d00);
        fVar85 = auVar21._0_4_;
        fVar106 = auVar118._0_4_ + fVar85;
        fVar89 = auVar21._4_4_;
        fVar123 = auVar118._4_4_ + fVar89;
        fVar158 = auVar21._8_4_;
        fVar124 = auVar118._8_4_ + fVar158;
        fVar164 = auVar21._12_4_;
        fVar125 = auVar118._12_4_ + fVar164;
        fVar104 = auVar21._16_4_;
        fVar126 = auVar118._16_4_ + fVar104;
        fVar14 = auVar21._20_4_;
        fVar127 = auVar118._20_4_ + fVar14;
        fVar17 = auVar21._24_4_;
        fVar128 = auVar118._24_4_ + fVar17;
        fVar20 = auVar21._28_4_;
        fVar209 = auVar118._28_4_;
        fVar86 = local_d00._0_4_;
        fVar178 = auVar22._0_4_ + fVar86;
        fVar91 = local_d00._4_4_;
        fVar192 = auVar22._4_4_ + fVar91;
        fVar160 = local_d00._8_4_;
        fVar193 = auVar22._8_4_ + fVar160;
        fVar166 = local_d00._12_4_;
        fVar194 = auVar22._12_4_ + fVar166;
        fVar105 = local_d00._16_4_;
        fVar195 = auVar22._16_4_ + fVar105;
        fVar15 = local_d00._20_4_;
        fVar196 = auVar22._20_4_ + fVar15;
        fVar18 = local_d00._24_4_;
        fVar197 = auVar22._24_4_ + fVar18;
        fVar75 = local_c60._0_4_;
        fVar84 = local_c60._4_4_;
        auVar23._4_4_ = fVar123 * fVar84;
        auVar23._0_4_ = fVar106 * fVar75;
        fVar87 = local_c60._8_4_;
        auVar23._8_4_ = fVar124 * fVar87;
        fVar90 = local_c60._12_4_;
        auVar23._12_4_ = fVar125 * fVar90;
        fVar93 = local_c60._16_4_;
        auVar23._16_4_ = fVar126 * fVar93;
        fVar102 = local_c60._20_4_;
        auVar23._20_4_ = fVar127 * fVar102;
        fVar103 = local_c60._24_4_;
        auVar23._24_4_ = fVar128 * fVar103;
        auVar23._28_4_ = auVar94._12_4_;
        fVar252 = local_c40._0_4_;
        fVar256 = local_c40._4_4_;
        auVar24._4_4_ = fVar256 * fVar192;
        auVar24._0_4_ = fVar252 * fVar178;
        fVar258 = local_c40._8_4_;
        auVar24._8_4_ = fVar258 * fVar193;
        fVar260 = local_c40._12_4_;
        auVar24._12_4_ = fVar260 * fVar194;
        fVar262 = local_c40._16_4_;
        auVar24._16_4_ = fVar262 * fVar195;
        fVar264 = local_c40._20_4_;
        auVar24._20_4_ = fVar264 * fVar196;
        fVar266 = local_c40._24_4_;
        auVar24._24_4_ = fVar266 * fVar197;
        auVar24._28_4_ = auVar95._12_4_;
        auVar23 = vsubps_avx(auVar24,auVar23);
        fVar88 = auVar80._0_4_;
        fVar210 = auVar117._0_4_ + fVar88;
        fVar92 = auVar80._4_4_;
        fVar217 = auVar117._4_4_ + fVar92;
        fVar162 = auVar80._8_4_;
        fVar218 = auVar117._8_4_ + fVar162;
        fVar167 = auVar80._12_4_;
        fVar219 = auVar117._12_4_ + fVar167;
        fVar13 = auVar80._16_4_;
        fVar220 = auVar117._16_4_ + fVar13;
        fVar16 = auVar80._20_4_;
        fVar221 = auVar117._20_4_ + fVar16;
        fVar19 = auVar80._24_4_;
        fVar222 = auVar117._24_4_ + fVar19;
        fVar240 = local_c20._0_4_;
        fVar243 = local_c20._4_4_;
        auVar25._4_4_ = fVar243 * fVar192;
        auVar25._0_4_ = fVar240 * fVar178;
        fVar244 = local_c20._8_4_;
        auVar25._8_4_ = fVar244 * fVar193;
        fVar245 = local_c20._12_4_;
        auVar25._12_4_ = fVar245 * fVar194;
        fVar246 = local_c20._16_4_;
        auVar25._16_4_ = fVar246 * fVar195;
        fVar247 = local_c20._20_4_;
        auVar25._20_4_ = fVar247 * fVar196;
        fVar248 = local_c20._24_4_;
        auVar25._24_4_ = fVar248 * fVar197;
        auVar25._28_4_ = auVar22._28_4_ + local_d00._28_4_;
        auVar27._4_4_ = fVar217 * fVar84;
        auVar27._0_4_ = fVar210 * fVar75;
        auVar27._8_4_ = fVar218 * fVar87;
        auVar27._12_4_ = fVar219 * fVar90;
        auVar27._16_4_ = fVar220 * fVar93;
        auVar27._20_4_ = fVar221 * fVar102;
        auVar27._24_4_ = fVar222 * fVar103;
        auVar27._28_4_ = auVar95._12_4_;
        auVar24 = vsubps_avx(auVar27,auVar25);
        auVar28._4_4_ = fVar217 * fVar256;
        auVar28._0_4_ = fVar210 * fVar252;
        auVar28._8_4_ = fVar218 * fVar258;
        auVar28._12_4_ = fVar219 * fVar260;
        auVar28._16_4_ = fVar220 * fVar262;
        auVar28._20_4_ = fVar221 * fVar264;
        auVar28._24_4_ = fVar222 * fVar266;
        auVar28._28_4_ = auVar117._28_4_ + auVar80._28_4_;
        auVar29._4_4_ = fVar243 * fVar123;
        auVar29._0_4_ = fVar240 * fVar106;
        auVar29._8_4_ = fVar244 * fVar124;
        auVar29._12_4_ = fVar245 * fVar125;
        auVar29._16_4_ = fVar246 * fVar126;
        auVar29._20_4_ = fVar247 * fVar127;
        auVar29._24_4_ = fVar248 * fVar128;
        auVar29._28_4_ = fVar209 + fVar20;
        auVar25 = vsubps_avx(auVar29,auVar28);
        local_e60._4_4_ = *(float *)(local_eb0 + local_eb8 * 4 + 0xa0);
        fVar106 = *(float *)(local_eb0 + local_eb8 * 4 + 0xc0);
        fStack_e90 = *(float *)(local_eb0 + local_eb8 * 4 + 0x80);
        local_ea0._4_4_ = fStack_e90;
        local_ea0._0_4_ = (uint)fStack_e90;
        fStack_e98 = fStack_e90;
        fStack_e94 = fStack_e90;
        local_b20._0_4_ =
             auVar23._0_4_ * fStack_e90 + auVar25._0_4_ * fVar106 + local_e60._4_4_ * auVar24._0_4_;
        local_b20._4_4_ =
             auVar23._4_4_ * fStack_e90 + auVar25._4_4_ * fVar106 + local_e60._4_4_ * auVar24._4_4_;
        local_b20._8_4_ =
             auVar23._8_4_ * fStack_e90 + auVar25._8_4_ * fVar106 + local_e60._4_4_ * auVar24._8_4_;
        local_b20._12_4_ =
             auVar23._12_4_ * fStack_e90 +
             auVar25._12_4_ * fVar106 + local_e60._4_4_ * auVar24._12_4_;
        local_b20._16_4_ =
             auVar23._16_4_ * fStack_e90 +
             auVar25._16_4_ * fVar106 + local_e60._4_4_ * auVar24._16_4_;
        local_b20._20_4_ =
             auVar23._20_4_ * fStack_e90 +
             auVar25._20_4_ * fVar106 + local_e60._4_4_ * auVar24._20_4_;
        local_b20._24_4_ =
             auVar23._24_4_ * fStack_e90 +
             auVar25._24_4_ * fVar106 + local_e60._4_4_ * auVar24._24_4_;
        local_b20._28_4_ = auVar24._28_4_ + auVar25._28_4_ + auVar24._28_4_;
        local_ae0 = vsubps_avx(auVar21,auVar81);
        auVar23 = vsubps_avx(local_d00,auVar98);
        fVar123 = fVar85 + auVar81._0_4_;
        fVar124 = fVar89 + auVar81._4_4_;
        fVar125 = fVar158 + auVar81._8_4_;
        fVar126 = fVar164 + auVar81._12_4_;
        fVar127 = fVar104 + auVar81._16_4_;
        fVar128 = fVar14 + auVar81._20_4_;
        fVar178 = fVar17 + auVar81._24_4_;
        fVar192 = auVar98._0_4_ + fVar86;
        fVar193 = auVar98._4_4_ + fVar91;
        fVar194 = auVar98._8_4_ + fVar160;
        fVar195 = auVar98._12_4_ + fVar166;
        fVar196 = auVar98._16_4_ + fVar105;
        fVar197 = auVar98._20_4_ + fVar15;
        fVar210 = auVar98._24_4_ + fVar18;
        fVar268 = auVar23._0_4_;
        fVar271 = auVar23._4_4_;
        auVar30._4_4_ = fVar271 * fVar124;
        auVar30._0_4_ = fVar268 * fVar123;
        fVar272 = auVar23._8_4_;
        auVar30._8_4_ = fVar272 * fVar125;
        fVar273 = auVar23._12_4_;
        auVar30._12_4_ = fVar273 * fVar126;
        fVar274 = auVar23._16_4_;
        auVar30._16_4_ = fVar274 * fVar127;
        fVar275 = auVar23._20_4_;
        auVar30._20_4_ = fVar275 * fVar128;
        fVar276 = auVar23._24_4_;
        auVar30._24_4_ = fVar276 * fVar178;
        auVar30._28_4_ = local_c40._28_4_;
        fVar225 = local_ae0._0_4_;
        fVar228 = local_ae0._4_4_;
        auVar31._4_4_ = fVar228 * fVar193;
        auVar31._0_4_ = fVar225 * fVar192;
        fVar230 = local_ae0._8_4_;
        auVar31._8_4_ = fVar230 * fVar194;
        fVar232 = local_ae0._12_4_;
        auVar31._12_4_ = fVar232 * fVar195;
        fVar234 = local_ae0._16_4_;
        auVar31._16_4_ = fVar234 * fVar196;
        fVar236 = local_ae0._20_4_;
        auVar31._20_4_ = fVar236 * fVar197;
        fVar238 = local_ae0._24_4_;
        auVar31._24_4_ = fVar238 * fVar210;
        auVar31._28_4_ = fVar20;
        auVar23 = vsubps_avx(auVar31,auVar30);
        auVar24 = vsubps_avx(auVar80,auVar116);
        fVar253 = auVar24._0_4_;
        fVar257 = auVar24._4_4_;
        auVar32._4_4_ = fVar257 * fVar193;
        auVar32._0_4_ = fVar253 * fVar192;
        fVar259 = auVar24._8_4_;
        auVar32._8_4_ = fVar259 * fVar194;
        fVar261 = auVar24._12_4_;
        auVar32._12_4_ = fVar261 * fVar195;
        fVar263 = auVar24._16_4_;
        auVar32._16_4_ = fVar263 * fVar196;
        fVar265 = auVar24._20_4_;
        auVar32._20_4_ = fVar265 * fVar197;
        fVar267 = auVar24._24_4_;
        auVar32._24_4_ = fVar267 * fVar210;
        auVar32._28_4_ = auVar98._28_4_ + local_d00._28_4_;
        fVar192 = auVar116._0_4_ + fVar88;
        fVar193 = auVar116._4_4_ + fVar92;
        fVar194 = auVar116._8_4_ + fVar162;
        fVar195 = auVar116._12_4_ + fVar167;
        fVar196 = auVar116._16_4_ + fVar13;
        fVar197 = auVar116._20_4_ + fVar16;
        fVar210 = auVar116._24_4_ + fVar19;
        fVar249 = auVar116._28_4_;
        auVar33._4_4_ = fVar193 * fVar271;
        auVar33._0_4_ = fVar192 * fVar268;
        auVar33._8_4_ = fVar194 * fVar272;
        auVar33._12_4_ = fVar195 * fVar273;
        auVar33._16_4_ = fVar196 * fVar274;
        auVar33._20_4_ = fVar197 * fVar275;
        auVar33._24_4_ = fVar210 * fVar276;
        auVar33._28_4_ = fVar249;
        auVar24 = vsubps_avx(auVar33,auVar32);
        auVar34._4_4_ = fVar193 * fVar228;
        auVar34._0_4_ = fVar192 * fVar225;
        auVar34._8_4_ = fVar194 * fVar230;
        auVar34._12_4_ = fVar195 * fVar232;
        auVar34._16_4_ = fVar196 * fVar234;
        auVar34._20_4_ = fVar197 * fVar236;
        auVar34._24_4_ = fVar210 * fVar238;
        auVar34._28_4_ = fVar249 + auVar80._28_4_;
        auVar35._4_4_ = fVar257 * fVar124;
        auVar35._0_4_ = fVar253 * fVar123;
        auVar35._8_4_ = fVar259 * fVar125;
        auVar35._12_4_ = fVar261 * fVar126;
        auVar35._16_4_ = fVar263 * fVar127;
        auVar35._20_4_ = fVar265 * fVar128;
        auVar35._24_4_ = fVar267 * fVar178;
        auVar35._28_4_ = fVar20 + auVar81._28_4_;
        auVar80 = vsubps_avx(auVar35,auVar34);
        auVar216 = ZEXT1664(local_e30);
        local_b40._0_4_ =
             fStack_e90 * auVar23._0_4_ + auVar80._0_4_ * fVar106 + local_e60._4_4_ * auVar24._0_4_;
        local_b40._4_4_ =
             fStack_e90 * auVar23._4_4_ + auVar80._4_4_ * fVar106 + local_e60._4_4_ * auVar24._4_4_;
        local_b40._8_4_ =
             fStack_e90 * auVar23._8_4_ + auVar80._8_4_ * fVar106 + local_e60._4_4_ * auVar24._8_4_;
        local_b40._12_4_ =
             fStack_e90 * auVar23._12_4_ +
             auVar80._12_4_ * fVar106 + local_e60._4_4_ * auVar24._12_4_;
        local_b40._16_4_ =
             fStack_e90 * auVar23._16_4_ +
             auVar80._16_4_ * fVar106 + local_e60._4_4_ * auVar24._16_4_;
        local_b40._20_4_ =
             fStack_e90 * auVar23._20_4_ +
             auVar80._20_4_ * fVar106 + local_e60._4_4_ * auVar24._20_4_;
        local_b40._24_4_ =
             fStack_e90 * auVar23._24_4_ +
             auVar80._24_4_ * fVar106 + local_e60._4_4_ * auVar24._24_4_;
        local_b40._28_4_ = auVar23._28_4_ + auVar80._28_4_ + auVar24._28_4_;
        auVar23 = vsubps_avx(auVar116,auVar117);
        fVar142 = auVar116._0_4_ + auVar117._0_4_;
        fVar156 = auVar116._4_4_ + auVar117._4_4_;
        fVar157 = auVar116._8_4_ + auVar117._8_4_;
        fVar159 = auVar116._12_4_ + auVar117._12_4_;
        fVar161 = auVar116._16_4_ + auVar117._16_4_;
        fVar163 = auVar116._20_4_ + auVar117._20_4_;
        fVar165 = auVar116._24_4_ + auVar117._24_4_;
        local_b00 = vsubps_avx(auVar81,auVar118);
        fVar218 = auVar118._0_4_ + auVar81._0_4_;
        fVar219 = auVar118._4_4_ + auVar81._4_4_;
        fVar220 = auVar118._8_4_ + auVar81._8_4_;
        fVar221 = auVar118._12_4_ + auVar81._12_4_;
        fVar222 = auVar118._16_4_ + auVar81._16_4_;
        fVar140 = auVar118._20_4_ + auVar81._20_4_;
        fVar141 = auVar118._24_4_ + auVar81._24_4_;
        auVar118 = vsubps_avx(auVar98,auVar22);
        fVar193 = auVar98._0_4_ + auVar22._0_4_;
        fVar194 = auVar98._4_4_ + auVar22._4_4_;
        fVar195 = auVar98._8_4_ + auVar22._8_4_;
        fVar196 = auVar98._12_4_ + auVar22._12_4_;
        fVar197 = auVar98._16_4_ + auVar22._16_4_;
        fVar210 = auVar98._20_4_ + auVar22._20_4_;
        fVar217 = auVar98._24_4_ + auVar22._24_4_;
        fVar20 = auVar118._0_4_;
        fVar123 = auVar118._4_4_;
        auVar36._4_4_ = fVar219 * fVar123;
        auVar36._0_4_ = fVar218 * fVar20;
        fVar124 = auVar118._8_4_;
        auVar36._8_4_ = fVar220 * fVar124;
        fVar125 = auVar118._12_4_;
        auVar36._12_4_ = fVar221 * fVar125;
        fVar126 = auVar118._16_4_;
        auVar36._16_4_ = fVar222 * fVar126;
        fVar127 = auVar118._20_4_;
        auVar36._20_4_ = fVar140 * fVar127;
        fVar128 = auVar118._24_4_;
        auVar36._24_4_ = fVar141 * fVar128;
        auVar36._28_4_ = auVar23._28_4_;
        fVar226 = local_b00._0_4_;
        fVar229 = local_b00._4_4_;
        auVar37._4_4_ = fVar229 * fVar194;
        auVar37._0_4_ = fVar226 * fVar193;
        fVar231 = local_b00._8_4_;
        auVar37._8_4_ = fVar231 * fVar195;
        fVar233 = local_b00._12_4_;
        auVar37._12_4_ = fVar233 * fVar196;
        fVar235 = local_b00._16_4_;
        auVar37._16_4_ = fVar235 * fVar197;
        fVar237 = local_b00._20_4_;
        auVar37._20_4_ = fVar237 * fVar210;
        fVar239 = local_b00._24_4_;
        auVar37._24_4_ = fVar239 * fVar217;
        auVar37._28_4_ = fVar209;
        auVar80 = vsubps_avx(auVar37,auVar36);
        fVar178 = auVar23._0_4_;
        fVar192 = auVar23._4_4_;
        auVar38._4_4_ = fVar192 * fVar194;
        auVar38._0_4_ = fVar178 * fVar193;
        fVar193 = auVar23._8_4_;
        auVar38._8_4_ = fVar193 * fVar195;
        fVar194 = auVar23._12_4_;
        auVar38._12_4_ = fVar194 * fVar196;
        fVar195 = auVar23._16_4_;
        auVar38._16_4_ = fVar195 * fVar197;
        fVar196 = auVar23._20_4_;
        auVar38._20_4_ = fVar196 * fVar210;
        fVar197 = auVar23._24_4_;
        auVar38._24_4_ = fVar197 * fVar217;
        auVar38._28_4_ = auVar98._28_4_ + auVar22._28_4_;
        auVar22._4_4_ = fVar156 * fVar123;
        auVar22._0_4_ = fVar142 * fVar20;
        auVar22._8_4_ = fVar157 * fVar124;
        auVar22._12_4_ = fVar159 * fVar125;
        auVar22._16_4_ = fVar161 * fVar126;
        auVar22._20_4_ = fVar163 * fVar127;
        auVar22._24_4_ = fVar165 * fVar128;
        auVar22._28_4_ = fVar209;
        auVar116 = vsubps_avx(auVar22,auVar38);
        auVar39._4_4_ = fVar229 * fVar156;
        auVar39._0_4_ = fVar226 * fVar142;
        auVar39._8_4_ = fVar231 * fVar157;
        auVar39._12_4_ = fVar233 * fVar159;
        auVar39._16_4_ = fVar235 * fVar161;
        auVar39._20_4_ = fVar237 * fVar163;
        auVar39._24_4_ = fVar239 * fVar165;
        auVar39._28_4_ = fVar249 + auVar117._28_4_;
        auVar40._4_4_ = fVar192 * fVar219;
        auVar40._0_4_ = fVar178 * fVar218;
        auVar40._8_4_ = fVar193 * fVar220;
        auVar40._12_4_ = fVar194 * fVar221;
        auVar40._16_4_ = fVar195 * fVar222;
        auVar40._20_4_ = fVar196 * fVar140;
        auVar40._24_4_ = fVar197 * fVar141;
        auVar40._28_4_ = fVar209 + auVar81._28_4_;
        auVar81 = vsubps_avx(auVar40,auVar39);
        local_e60._0_4_ = local_e60._4_4_;
        fStack_e58 = local_e60._4_4_;
        fStack_e54 = local_e60._4_4_;
        fStack_e50 = local_e60._4_4_;
        fStack_e4c = local_e60._4_4_;
        fStack_e48 = local_e60._4_4_;
        fStack_e44 = local_e60._4_4_;
        auVar99._0_4_ =
             fStack_e90 * auVar80._0_4_ + auVar81._0_4_ * fVar106 + local_e60._4_4_ * auVar116._0_4_
        ;
        auVar99._4_4_ =
             fStack_e90 * auVar80._4_4_ + auVar81._4_4_ * fVar106 + local_e60._4_4_ * auVar116._4_4_
        ;
        auVar99._8_4_ =
             fStack_e90 * auVar80._8_4_ + auVar81._8_4_ * fVar106 + local_e60._4_4_ * auVar116._8_4_
        ;
        auVar99._12_4_ =
             fStack_e90 * auVar80._12_4_ +
             auVar81._12_4_ * fVar106 + local_e60._4_4_ * auVar116._12_4_;
        auVar99._16_4_ =
             fStack_e90 * auVar80._16_4_ +
             auVar81._16_4_ * fVar106 + local_e60._4_4_ * auVar116._16_4_;
        auVar99._20_4_ =
             fStack_e90 * auVar80._20_4_ +
             auVar81._20_4_ * fVar106 + local_e60._4_4_ * auVar116._20_4_;
        auVar99._24_4_ =
             fStack_e90 * auVar80._24_4_ +
             auVar81._24_4_ * fVar106 + local_e60._4_4_ * auVar116._24_4_;
        auVar99._28_4_ = auVar81._28_4_ + auVar81._28_4_ + auVar116._28_4_;
        local_a40._0_4_ = auVar99._0_4_ + local_b20._0_4_ + local_b40._0_4_;
        local_a40._4_4_ = auVar99._4_4_ + local_b20._4_4_ + local_b40._4_4_;
        local_a40._8_4_ = auVar99._8_4_ + local_b20._8_4_ + local_b40._8_4_;
        local_a40._12_4_ = auVar99._12_4_ + local_b20._12_4_ + local_b40._12_4_;
        local_a40._16_4_ = auVar99._16_4_ + local_b20._16_4_ + local_b40._16_4_;
        local_a40._20_4_ = auVar99._20_4_ + local_b20._20_4_ + local_b40._20_4_;
        local_a40._24_4_ = auVar99._24_4_ + local_b20._24_4_ + local_b40._24_4_;
        local_a40._28_4_ = auVar99._28_4_ + local_b20._28_4_ + local_b40._28_4_;
        auVar80 = vminps_avx(local_b20,local_b40);
        auVar80 = vminps_avx(auVar80,auVar99);
        auVar154._8_4_ = 0x7fffffff;
        auVar154._0_8_ = 0x7fffffff7fffffff;
        auVar154._12_4_ = 0x7fffffff;
        auVar154._16_4_ = 0x7fffffff;
        auVar154._20_4_ = 0x7fffffff;
        auVar154._24_4_ = 0x7fffffff;
        auVar154._28_4_ = 0x7fffffff;
        local_ba0 = vandps_avx(local_a40,auVar154);
        fVar210 = local_ba0._0_4_ * 1.1920929e-07;
        fVar217 = local_ba0._4_4_ * 1.1920929e-07;
        auVar41._4_4_ = fVar217;
        auVar41._0_4_ = fVar210;
        fVar218 = local_ba0._8_4_ * 1.1920929e-07;
        auVar41._8_4_ = fVar218;
        fVar219 = local_ba0._12_4_ * 1.1920929e-07;
        auVar41._12_4_ = fVar219;
        fVar220 = local_ba0._16_4_ * 1.1920929e-07;
        auVar41._16_4_ = fVar220;
        fVar221 = local_ba0._20_4_ * 1.1920929e-07;
        auVar41._20_4_ = fVar221;
        fVar222 = local_ba0._24_4_ * 1.1920929e-07;
        auVar41._24_4_ = fVar222;
        auVar41._28_4_ = 0x34000000;
        auVar173._0_8_ = CONCAT44(fVar217,fVar210) ^ 0x8000000080000000;
        auVar173._8_4_ = -fVar218;
        auVar173._12_4_ = -fVar219;
        auVar173._16_4_ = -fVar220;
        auVar173._20_4_ = -fVar221;
        auVar173._24_4_ = -fVar222;
        auVar173._28_4_ = 0xb4000000;
        auVar80 = vcmpps_avx(auVar80,auVar173,5);
        auVar116 = vmaxps_avx(local_b20,local_b40);
        auVar116 = vmaxps_avx(auVar116,auVar99);
        auVar116 = vcmpps_avx(auVar116,auVar41,2);
        auVar80 = vorps_avx(auVar80,auVar116);
        k = local_eb8;
        ray = local_eb0;
        if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar80 >> 0x7f,0) != '\0') ||
              (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar80 >> 0xbf,0) != '\0') ||
            (auVar80 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar80[0x1f] < '\0') {
          auVar42._4_4_ = fVar228 * fVar84;
          auVar42._0_4_ = fVar225 * fVar75;
          auVar42._8_4_ = fVar230 * fVar87;
          auVar42._12_4_ = fVar232 * fVar90;
          auVar42._16_4_ = fVar234 * fVar93;
          auVar42._20_4_ = fVar236 * fVar102;
          auVar42._24_4_ = fVar238 * fVar103;
          auVar42._28_4_ = auVar116._28_4_;
          auVar43._4_4_ = fVar256 * fVar271;
          auVar43._0_4_ = fVar252 * fVar268;
          auVar43._8_4_ = fVar258 * fVar272;
          auVar43._12_4_ = fVar260 * fVar273;
          auVar43._16_4_ = fVar262 * fVar274;
          auVar43._20_4_ = fVar264 * fVar275;
          auVar43._24_4_ = fVar266 * fVar276;
          auVar43._28_4_ = 0x34000000;
          auVar98 = vsubps_avx(auVar43,auVar42);
          auVar44._4_4_ = fVar271 * fVar229;
          auVar44._0_4_ = fVar268 * fVar226;
          auVar44._8_4_ = fVar272 * fVar231;
          auVar44._12_4_ = fVar273 * fVar233;
          auVar44._16_4_ = fVar274 * fVar235;
          auVar44._20_4_ = fVar275 * fVar237;
          auVar44._24_4_ = fVar276 * fVar239;
          auVar44._28_4_ = local_b00._28_4_;
          auVar45._4_4_ = fVar228 * fVar123;
          auVar45._0_4_ = fVar225 * fVar20;
          auVar45._8_4_ = fVar230 * fVar124;
          auVar45._12_4_ = fVar232 * fVar125;
          auVar45._16_4_ = fVar234 * fVar126;
          auVar45._20_4_ = fVar236 * fVar127;
          auVar45._24_4_ = fVar238 * fVar128;
          auVar45._28_4_ = fVar209;
          auVar22 = vsubps_avx(auVar45,auVar44);
          auVar189._8_4_ = 0x7fffffff;
          auVar189._0_8_ = 0x7fffffff7fffffff;
          auVar189._12_4_ = 0x7fffffff;
          auVar189._16_4_ = 0x7fffffff;
          auVar189._20_4_ = 0x7fffffff;
          auVar189._24_4_ = 0x7fffffff;
          auVar189._28_4_ = 0x7fffffff;
          auVar116 = vandps_avx(auVar42,auVar189);
          auVar81 = vandps_avx(auVar44,auVar189);
          auVar116 = vcmpps_avx(auVar116,auVar81,1);
          auVar117 = vblendvps_avx(auVar22,auVar98,auVar116);
          auVar46._4_4_ = fVar257 * fVar123;
          auVar46._0_4_ = fVar253 * fVar20;
          auVar46._8_4_ = fVar259 * fVar124;
          auVar46._12_4_ = fVar261 * fVar125;
          auVar46._16_4_ = fVar263 * fVar126;
          auVar46._20_4_ = fVar265 * fVar127;
          auVar46._24_4_ = fVar267 * fVar128;
          auVar46._28_4_ = auVar98._28_4_;
          auVar47._4_4_ = fVar257 * fVar84;
          auVar47._0_4_ = fVar253 * fVar75;
          auVar47._8_4_ = fVar259 * fVar87;
          auVar47._12_4_ = fVar261 * fVar90;
          auVar47._16_4_ = fVar263 * fVar93;
          auVar47._20_4_ = fVar265 * fVar102;
          auVar47._24_4_ = fVar267 * fVar103;
          auVar47._28_4_ = auVar81._28_4_;
          auVar48._4_4_ = fVar243 * fVar271;
          auVar48._0_4_ = fVar240 * fVar268;
          auVar48._8_4_ = fVar244 * fVar272;
          auVar48._12_4_ = fVar245 * fVar273;
          auVar48._16_4_ = fVar246 * fVar274;
          auVar48._20_4_ = fVar247 * fVar275;
          auVar48._24_4_ = fVar248 * fVar276;
          auVar48._28_4_ = local_c60._28_4_;
          auVar98 = vsubps_avx(auVar47,auVar48);
          auVar49._4_4_ = fVar271 * fVar192;
          auVar49._0_4_ = fVar268 * fVar178;
          auVar49._8_4_ = fVar272 * fVar193;
          auVar49._12_4_ = fVar273 * fVar194;
          auVar49._16_4_ = fVar274 * fVar195;
          auVar49._20_4_ = fVar275 * fVar196;
          auVar49._24_4_ = fVar276 * fVar197;
          auVar49._28_4_ = auVar22._28_4_;
          auVar22 = vsubps_avx(auVar49,auVar46);
          auVar116 = vandps_avx(auVar48,auVar189);
          auVar81 = vandps_avx(auVar46,auVar189);
          auVar81 = vcmpps_avx(auVar116,auVar81,1);
          auVar22 = vblendvps_avx(auVar22,auVar98,auVar81);
          auVar50._4_4_ = fVar228 * fVar192;
          auVar50._0_4_ = fVar225 * fVar178;
          auVar50._8_4_ = fVar230 * fVar193;
          auVar50._12_4_ = fVar232 * fVar194;
          auVar50._16_4_ = fVar234 * fVar195;
          auVar50._20_4_ = fVar236 * fVar196;
          auVar50._24_4_ = fVar238 * fVar197;
          auVar50._28_4_ = auVar118._28_4_;
          auVar51._4_4_ = fVar243 * fVar228;
          auVar51._0_4_ = fVar240 * fVar225;
          auVar51._8_4_ = fVar244 * fVar230;
          auVar51._12_4_ = fVar245 * fVar232;
          auVar51._16_4_ = fVar246 * fVar234;
          auVar51._20_4_ = fVar247 * fVar236;
          auVar51._24_4_ = fVar248 * fVar238;
          auVar51._28_4_ = auVar81._28_4_;
          auVar52._4_4_ = fVar257 * fVar256;
          auVar52._0_4_ = fVar253 * fVar252;
          auVar52._8_4_ = fVar259 * fVar258;
          auVar52._12_4_ = fVar261 * fVar260;
          auVar52._16_4_ = fVar263 * fVar262;
          auVar52._20_4_ = fVar265 * fVar264;
          auVar52._24_4_ = fVar267 * fVar266;
          auVar52._28_4_ = auVar98._28_4_;
          auVar53._4_4_ = fVar257 * fVar229;
          auVar53._0_4_ = fVar253 * fVar226;
          auVar53._8_4_ = fVar259 * fVar231;
          auVar53._12_4_ = fVar261 * fVar233;
          auVar53._16_4_ = fVar263 * fVar235;
          auVar53._20_4_ = fVar265 * fVar237;
          auVar53._24_4_ = fVar267 * fVar239;
          auVar53._28_4_ = auVar23._28_4_;
          auVar118 = vsubps_avx(auVar51,auVar52);
          auVar23 = vsubps_avx(auVar53,auVar50);
          auVar81 = vandps_avx(auVar52,auVar189);
          auVar98 = vandps_avx(auVar50,auVar189);
          auVar98 = vcmpps_avx(auVar81,auVar98,1);
          auVar98 = vblendvps_avx(auVar23,auVar118,auVar98);
          auVar77 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
          fVar75 = auVar98._0_4_;
          fVar84 = auVar98._4_4_;
          fVar123 = auVar98._8_4_;
          fVar87 = auVar98._12_4_;
          fVar124 = auVar98._16_4_;
          fVar90 = auVar98._20_4_;
          fVar125 = auVar98._24_4_;
          fVar217 = auVar22._0_4_;
          fVar218 = auVar22._4_4_;
          fVar219 = auVar22._8_4_;
          fVar220 = auVar22._12_4_;
          fVar221 = auVar22._16_4_;
          fVar222 = auVar22._20_4_;
          fVar20 = auVar118._28_4_;
          fVar140 = auVar22._24_4_;
          fVar93 = auVar117._0_4_;
          fVar126 = auVar117._4_4_;
          fVar102 = auVar117._8_4_;
          fVar127 = auVar117._12_4_;
          fVar103 = auVar117._16_4_;
          fVar128 = auVar117._20_4_;
          fVar178 = auVar117._24_4_;
          fVar192 = fVar93 * fStack_e90 + fVar75 * fVar106 + fVar217 * local_e60._4_4_;
          fVar193 = fVar126 * fStack_e90 + fVar84 * fVar106 + fVar218 * local_e60._4_4_;
          fVar194 = fVar102 * fStack_e90 + fVar123 * fVar106 + fVar219 * local_e60._4_4_;
          fVar195 = fVar127 * fStack_e90 + fVar87 * fVar106 + fVar220 * local_e60._4_4_;
          fVar196 = fVar103 * fStack_e90 + fVar124 * fVar106 + fVar221 * local_e60._4_4_;
          fVar197 = fVar128 * fStack_e90 + fVar90 * fVar106 + fVar222 * local_e60._4_4_;
          fVar106 = fVar178 * fStack_e90 + fVar125 * fVar106 + fVar140 * local_e60._4_4_;
          fVar210 = fVar20 + fVar20 + 0.0;
          auVar119._0_4_ = fVar192 + fVar192;
          auVar119._4_4_ = fVar193 + fVar193;
          auVar119._8_4_ = fVar194 + fVar194;
          auVar119._12_4_ = fVar195 + fVar195;
          auVar119._16_4_ = fVar196 + fVar196;
          auVar119._20_4_ = fVar197 + fVar197;
          auVar119._24_4_ = fVar106 + fVar106;
          auVar119._28_4_ = fVar210 + fVar210;
          fVar192 = fVar93 * fVar88 + fVar75 * fVar86 + fVar217 * fVar85;
          fVar193 = fVar126 * fVar92 + fVar84 * fVar91 + fVar218 * fVar89;
          fVar158 = fVar102 * fVar162 + fVar123 * fVar160 + fVar219 * fVar158;
          fVar160 = fVar127 * fVar167 + fVar87 * fVar166 + fVar220 * fVar164;
          fVar162 = fVar103 * fVar13 + fVar124 * fVar105 + fVar221 * fVar104;
          fVar164 = fVar128 * fVar16 + fVar90 * fVar15 + fVar222 * fVar14;
          fVar166 = fVar178 * fVar19 + fVar125 * fVar18 + fVar140 * fVar17;
          fVar167 = auVar81._28_4_ + fVar20 + auVar81._28_4_;
          auVar80 = vrcpps_avx(auVar119);
          fVar106 = auVar80._0_4_;
          fVar85 = auVar80._4_4_;
          auVar54._4_4_ = auVar119._4_4_ * fVar85;
          auVar54._0_4_ = auVar119._0_4_ * fVar106;
          fVar86 = auVar80._8_4_;
          auVar54._8_4_ = auVar119._8_4_ * fVar86;
          fVar88 = auVar80._12_4_;
          auVar54._12_4_ = auVar119._12_4_ * fVar88;
          fVar89 = auVar80._16_4_;
          auVar54._16_4_ = auVar119._16_4_ * fVar89;
          fVar91 = auVar80._20_4_;
          auVar54._20_4_ = auVar119._20_4_ * fVar91;
          fVar92 = auVar80._24_4_;
          auVar54._24_4_ = auVar119._24_4_ * fVar92;
          auVar54._28_4_ = auVar116._28_4_;
          auVar190._8_4_ = 0x3f800000;
          auVar190._0_8_ = 0x3f8000003f800000;
          auVar190._12_4_ = 0x3f800000;
          auVar190._16_4_ = 0x3f800000;
          auVar190._20_4_ = 0x3f800000;
          auVar190._24_4_ = 0x3f800000;
          auVar190._28_4_ = 0x3f800000;
          auVar80 = vsubps_avx(auVar190,auVar54);
          local_9a0._4_4_ = (fVar193 + fVar193) * (fVar85 + fVar85 * auVar80._4_4_);
          local_9a0._0_4_ = (fVar192 + fVar192) * (fVar106 + fVar106 * auVar80._0_4_);
          local_9a0._8_4_ = (fVar158 + fVar158) * (fVar86 + fVar86 * auVar80._8_4_);
          local_9a0._12_4_ = (fVar160 + fVar160) * (fVar88 + fVar88 * auVar80._12_4_);
          local_9a0._16_4_ = (fVar162 + fVar162) * (fVar89 + fVar89 * auVar80._16_4_);
          local_9a0._20_4_ = (fVar164 + fVar164) * (fVar91 + fVar91 * auVar80._20_4_);
          local_9a0._24_4_ = (fVar166 + fVar166) * (fVar92 + fVar92 * auVar80._24_4_);
          local_9a0._28_4_ = fVar167 + fVar167;
          uVar66 = *(undefined4 *)(local_eb0 + local_eb8 * 4 + 0x60);
          auVar174._4_4_ = uVar66;
          auVar174._0_4_ = uVar66;
          auVar174._8_4_ = uVar66;
          auVar174._12_4_ = uVar66;
          auVar174._16_4_ = uVar66;
          auVar174._20_4_ = uVar66;
          auVar174._24_4_ = uVar66;
          auVar174._28_4_ = uVar66;
          auVar80 = vcmpps_avx(auVar174,local_9a0,2);
          uVar66 = *(undefined4 *)(local_eb0 + local_eb8 * 4 + 0x100);
          local_d40._4_4_ = uVar66;
          local_d40._0_4_ = uVar66;
          local_d40._8_4_ = uVar66;
          local_d40._12_4_ = uVar66;
          local_d40._16_4_ = uVar66;
          local_d40._20_4_ = uVar66;
          local_d40._24_4_ = uVar66;
          local_d40._28_4_ = uVar66;
          auVar177 = ZEXT3264(local_d40);
          auVar116 = vcmpps_avx(local_9a0,local_d40,2);
          auVar80 = vandps_avx(auVar116,auVar80);
          auVar94 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
          auVar77 = vpand_avx(auVar94,auVar77);
          auVar94 = vpmovsxwd_avx(auVar77);
          auVar107 = vpshufd_avx(auVar77,0xee);
          auVar107 = vpmovsxwd_avx(auVar107);
          auVar175._16_16_ = auVar107;
          auVar175._0_16_ = auVar94;
          if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar175 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar175 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar175 >> 0x7f,0) != '\0') ||
                (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar107 >> 0x3f,0) != '\0') ||
              (auVar175 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar107[0xf] < '\0') {
            auVar80 = vcmpps_avx(auVar119,_DAT_01f7b000,4);
            auVar94 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
            auVar77 = vpand_avx(auVar77,auVar94);
            auVar94 = vpmovsxwd_avx(auVar77);
            auVar107 = vpunpckhwd_avx(auVar77,auVar77);
            local_a00._16_16_ = auVar107;
            local_a00._0_16_ = auVar94;
            if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_a00 >> 0x7f,0) != '\0') ||
                  (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB161(auVar107 >> 0x3f,0) != '\0') ||
                (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar107[0xf] < '\0') {
              local_a20 = &local_ec1;
              auVar80 = vsubps_avx(local_a40,local_b40);
              auVar80 = vblendvps_avx(local_b20,auVar80,local_b60);
              auVar116 = vsubps_avx(local_a40,local_b20);
              auVar116 = vblendvps_avx(local_b40,auVar116,local_b60);
              local_980[0] = (float)local_b80._0_4_ * fVar93;
              local_980[1] = (float)local_b80._4_4_ * fVar126;
              local_980[2] = fStack_b78 * fVar102;
              local_980[3] = fStack_b74 * fVar127;
              fStack_970 = fStack_b70 * fVar103;
              fStack_96c = fStack_b6c * fVar128;
              fStack_968 = fStack_b68 * fVar178;
              uStack_964 = auVar117._28_4_;
              local_960[0] = fVar217 * (float)local_b80._0_4_;
              local_960[1] = fVar218 * (float)local_b80._4_4_;
              local_960[2] = fVar219 * fStack_b78;
              local_960[3] = fVar220 * fStack_b74;
              fStack_950 = fVar221 * fStack_b70;
              fStack_94c = fVar222 * fStack_b6c;
              fStack_948 = fVar140 * fStack_b68;
              uStack_944 = auVar117._28_4_;
              local_940[0] = (float)local_b80._0_4_ * fVar75;
              local_940[1] = (float)local_b80._4_4_ * fVar84;
              local_940[2] = fStack_b78 * fVar123;
              local_940[3] = fStack_b74 * fVar87;
              fStack_930 = fStack_b70 * fVar124;
              fStack_92c = fStack_b6c * fVar90;
              fStack_928 = fStack_b68 * fVar125;
              uStack_924 = auVar98._28_4_;
              auVar94 = vpshufd_avx(ZEXT416(local_ea4),0);
              auVar94 = vpaddd_avx(auVar94,_DAT_01f76ad0);
              auVar152._0_4_ = (float)(int)(*(ushort *)(local_d78 + 8 + local_d80) - 1);
              auVar152._4_12_ = local_e30._4_12_;
              auVar107 = vpshufd_avx(ZEXT416(local_ea8),0);
              auVar107 = vpaddd_avx(auVar107,_DAT_01f76ae0);
              auVar76 = vrcpss_avx(auVar152,auVar152);
              auVar187._0_4_ = (float)(int)(*(ushort *)(local_d78 + 10 + local_d80) - 1);
              auVar187._4_12_ = local_e30._4_12_;
              auVar108 = vrcpss_avx(auVar187,auVar187);
              auVar82._16_16_ = auVar94;
              auVar82._0_16_ = auVar94;
              auVar81 = vcvtdq2ps_avx(auVar82);
              fVar158 = auVar81._28_4_ + auVar80._28_4_;
              auVar94 = ZEXT416((uint)(auVar76._0_4_ * (2.0 - auVar76._0_4_ * auVar152._0_4_)));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              fVar106 = (local_a40._0_4_ * auVar81._0_4_ + auVar80._0_4_) * auVar94._0_4_;
              fVar85 = (local_a40._4_4_ * auVar81._4_4_ + auVar80._4_4_) * auVar94._4_4_;
              local_a80._4_4_ = fVar85;
              local_a80._0_4_ = fVar106;
              fVar86 = (local_a40._8_4_ * auVar81._8_4_ + auVar80._8_4_) * auVar94._8_4_;
              local_a80._8_4_ = fVar86;
              fVar88 = (local_a40._12_4_ * auVar81._12_4_ + auVar80._12_4_) * auVar94._12_4_;
              local_a80._12_4_ = fVar88;
              fVar89 = (local_a40._16_4_ * auVar81._16_4_ + auVar80._16_4_) * auVar94._0_4_;
              local_a80._16_4_ = fVar89;
              fVar91 = (local_a40._20_4_ * auVar81._20_4_ + auVar80._20_4_) * auVar94._4_4_;
              local_a80._20_4_ = fVar91;
              fVar92 = (local_a40._24_4_ * auVar81._24_4_ + auVar80._24_4_) * auVar94._8_4_;
              local_a80._24_4_ = fVar92;
              local_a80._28_4_ = fVar158;
              auVar100._16_16_ = auVar107;
              auVar100._0_16_ = auVar107;
              auVar80 = vcvtdq2ps_avx(auVar100);
              auVar94 = ZEXT416((uint)(auVar108._0_4_ * (2.0 - auVar108._0_4_ * auVar187._0_4_)));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              fVar160 = (local_a40._0_4_ * auVar80._0_4_ + auVar116._0_4_) * auVar94._0_4_;
              fVar162 = (local_a40._4_4_ * auVar80._4_4_ + auVar116._4_4_) * auVar94._4_4_;
              local_a60._4_4_ = fVar162;
              local_a60._0_4_ = fVar160;
              fVar164 = (local_a40._8_4_ * auVar80._8_4_ + auVar116._8_4_) * auVar94._8_4_;
              local_a60._8_4_ = fVar164;
              fVar166 = (local_a40._12_4_ * auVar80._12_4_ + auVar116._12_4_) * auVar94._12_4_;
              local_a60._12_4_ = fVar166;
              fVar167 = (local_a40._16_4_ * auVar80._16_4_ + auVar116._16_4_) * auVar94._0_4_;
              local_a60._16_4_ = fVar167;
              fVar104 = (local_a40._20_4_ * auVar80._20_4_ + auVar116._20_4_) * auVar94._4_4_;
              local_a60._20_4_ = fVar104;
              fVar105 = (local_a40._24_4_ * auVar80._24_4_ + auVar116._24_4_) * auVar94._8_4_;
              local_a60._24_4_ = fVar105;
              local_a60._28_4_ = auVar80._28_4_ + auVar116._28_4_;
              pGVar69 = (local_d70->geometries).items[local_e68].ptr;
              if ((pGVar69->mask & *(uint *)(local_eb0 + local_eb8 * 4 + 0x120)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar69->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00fa7a65:
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                  goto LAB_00fa7a81;
                }
                auVar80 = vrcpps_avx(local_a40);
                fVar13 = auVar80._0_4_;
                fVar14 = auVar80._4_4_;
                auVar55._4_4_ = local_a40._4_4_ * fVar14;
                auVar55._0_4_ = local_a40._0_4_ * fVar13;
                fVar15 = auVar80._8_4_;
                auVar55._8_4_ = local_a40._8_4_ * fVar15;
                fVar16 = auVar80._12_4_;
                auVar55._12_4_ = local_a40._12_4_ * fVar16;
                fVar17 = auVar80._16_4_;
                auVar55._16_4_ = local_a40._16_4_ * fVar17;
                fVar18 = auVar80._20_4_;
                auVar55._20_4_ = local_a40._20_4_ * fVar18;
                fVar19 = auVar80._24_4_;
                auVar55._24_4_ = local_a40._24_4_ * fVar19;
                auVar55._28_4_ = local_a40._28_4_;
                auVar176._8_4_ = 0x3f800000;
                auVar176._0_8_ = 0x3f8000003f800000;
                auVar176._12_4_ = 0x3f800000;
                auVar176._16_4_ = 0x3f800000;
                auVar176._20_4_ = 0x3f800000;
                auVar176._24_4_ = 0x3f800000;
                auVar176._28_4_ = 0x3f800000;
                auVar116 = vsubps_avx(auVar176,auVar55);
                auVar120._0_4_ = fVar13 + fVar13 * auVar116._0_4_;
                auVar120._4_4_ = fVar14 + fVar14 * auVar116._4_4_;
                auVar120._8_4_ = fVar15 + fVar15 * auVar116._8_4_;
                auVar120._12_4_ = fVar16 + fVar16 * auVar116._12_4_;
                auVar120._16_4_ = fVar17 + fVar17 * auVar116._16_4_;
                auVar120._20_4_ = fVar18 + fVar18 * auVar116._20_4_;
                auVar120._24_4_ = fVar19 + fVar19 * auVar116._24_4_;
                auVar120._28_4_ = auVar80._28_4_ + auVar116._28_4_;
                auVar155._8_4_ = 0x219392ef;
                auVar155._0_8_ = 0x219392ef219392ef;
                auVar155._12_4_ = 0x219392ef;
                auVar155._16_4_ = 0x219392ef;
                auVar155._20_4_ = 0x219392ef;
                auVar155._24_4_ = 0x219392ef;
                auVar155._28_4_ = 0x219392ef;
                auVar80 = vcmpps_avx(local_ba0,auVar155,5);
                auVar80 = vandps_avx(auVar80,auVar120);
                auVar56._4_4_ = fVar85 * auVar80._4_4_;
                auVar56._0_4_ = fVar106 * auVar80._0_4_;
                auVar56._8_4_ = fVar86 * auVar80._8_4_;
                auVar56._12_4_ = fVar88 * auVar80._12_4_;
                auVar56._16_4_ = fVar89 * auVar80._16_4_;
                auVar56._20_4_ = fVar91 * auVar80._20_4_;
                auVar56._24_4_ = fVar92 * auVar80._24_4_;
                auVar56._28_4_ = fVar158;
                local_9e0 = vminps_avx(auVar56,auVar176);
                auVar57._4_4_ = fVar162 * auVar80._4_4_;
                auVar57._0_4_ = fVar160 * auVar80._0_4_;
                auVar57._8_4_ = fVar164 * auVar80._8_4_;
                auVar57._12_4_ = fVar166 * auVar80._12_4_;
                auVar57._16_4_ = fVar167 * auVar80._16_4_;
                auVar57._20_4_ = fVar104 * auVar80._20_4_;
                auVar57._24_4_ = fVar105 * auVar80._24_4_;
                auVar57._28_4_ = local_9e0._28_4_;
                local_9c0 = vminps_avx(auVar57,auVar176);
                auVar77 = vpacksswb_avx(auVar77,auVar77);
                bVar26 = SUB161(auVar77 >> 7,0) & 1 | (SUB161(auVar77 >> 0xf,0) & 1) << 1 |
                         (SUB161(auVar77 >> 0x17,0) & 1) << 2 | (SUB161(auVar77 >> 0x1f,0) & 1) << 3
                         | (SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                         (SUB161(auVar77 >> 0x2f,0) & 1) << 5 | (SUB161(auVar77 >> 0x37,0) & 1) << 6
                         | SUB161(auVar77 >> 0x3f,0) << 7;
                uVar59 = (ulong)bVar26;
                uVar71 = 0;
                if (uVar59 != 0) {
                  for (; (bVar26 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
                  }
                }
                auVar77 = vshufps_avx(ZEXT416(uVar62),ZEXT416(uVar62),0);
                local_e00._16_16_ = auVar77;
                local_e00._0_16_ = auVar77;
                auVar77 = vshufps_avx(ZEXT416(uVar6),ZEXT416(uVar6),0);
                local_e20._16_16_ = auVar77;
                local_e20._0_16_ = auVar77;
                auStack_d58 = auVar21._8_24_;
                local_d60 = pGVar69;
                fStack_e8c = fStack_e90;
                fStack_e88 = fStack_e90;
                fStack_e84 = fStack_e90;
                while (uVar59 != 0) {
                  local_8c0 = *(undefined4 *)(local_9e0 + uVar71 * 4);
                  local_8a0 = *(undefined4 *)(local_9c0 + uVar71 * 4);
                  *(float *)(ray + k * 4 + 0x100) = local_980[uVar71 - 8];
                  local_c90.context = context->user;
                  local_920 = local_980[uVar71];
                  local_900 = local_960[uVar71];
                  fVar106 = local_940[uVar71];
                  local_8e0._4_4_ = fVar106;
                  local_8e0._0_4_ = fVar106;
                  local_8e0._8_4_ = fVar106;
                  local_8e0._12_4_ = fVar106;
                  local_8e0._16_4_ = fVar106;
                  local_8e0._20_4_ = fVar106;
                  local_8e0._24_4_ = fVar106;
                  local_8e0._28_4_ = fVar106;
                  fStack_91c = local_920;
                  fStack_918 = local_920;
                  fStack_914 = local_920;
                  fStack_910 = local_920;
                  fStack_90c = local_920;
                  fStack_908 = local_920;
                  fStack_904 = local_920;
                  fStack_8fc = local_900;
                  fStack_8f8 = local_900;
                  fStack_8f4 = local_900;
                  fStack_8f0 = local_900;
                  fStack_8ec = local_900;
                  fStack_8e8 = local_900;
                  fStack_8e4 = local_900;
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  local_880 = local_e20._0_8_;
                  uStack_878 = local_e20._8_8_;
                  uStack_870 = local_e20._16_8_;
                  uStack_868 = local_e20._24_8_;
                  local_860 = local_e00._0_8_;
                  uStack_858 = local_e00._8_8_;
                  uStack_850 = local_e00._16_8_;
                  uStack_848 = local_e00._24_8_;
                  auVar80 = vcmpps_avx(local_8e0,local_8e0,0xf);
                  uStack_83c = (local_c90.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_c90.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_d20 = *local_dc0;
                  local_d10 = *local_dc8;
                  local_c90.valid = (int *)local_d20;
                  local_c90.geometryUserPtr = pGVar69->userPtr;
                  local_c90.hit = (RTCHitN *)&local_920;
                  local_c90.N = 8;
                  local_c90.ray = (RTCRayN *)ray;
                  if (pGVar69->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_ea0 = uVar59;
                    local_e60 = uVar71;
                    auVar80 = ZEXT1632(auVar80._0_16_);
                    (*pGVar69->occlusionFilterN)(&local_c90);
                    auVar177 = ZEXT3264(local_d40);
                    auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                    auVar216 = ZEXT1664(local_e30);
                    k = local_eb8;
                    pGVar69 = local_d60;
                    uVar59 = local_ea0;
                    uVar71 = local_e60;
                    ray = local_eb0;
                  }
                  auVar77 = vpcmpeqd_avx(local_d20,ZEXT816(0) << 0x40);
                  auVar94 = vpcmpeqd_avx(local_d10,ZEXT816(0) << 0x40);
                  auVar121._16_16_ = auVar94;
                  auVar121._0_16_ = auVar77;
                  auVar116 = auVar80 & ~auVar121;
                  if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar116 >> 0x7f,0) == '\0') &&
                        (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar116 >> 0xbf,0) == '\0') &&
                      (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar116[0x1f]) {
                    auVar83._0_4_ = auVar77._0_4_ ^ auVar80._0_4_;
                    auVar83._4_4_ = auVar77._4_4_ ^ auVar80._4_4_;
                    auVar83._8_4_ = auVar77._8_4_ ^ auVar80._8_4_;
                    auVar83._12_4_ = auVar77._12_4_ ^ auVar80._12_4_;
                    auVar83._16_4_ = auVar94._0_4_ ^ auVar80._16_4_;
                    auVar83._20_4_ = auVar94._4_4_ ^ auVar80._20_4_;
                    auVar83._24_4_ = auVar94._8_4_ ^ auVar80._24_4_;
                    auVar83._28_4_ = auVar94._12_4_ ^ auVar80._28_4_;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                      local_ea0 = uVar59;
                      local_e60 = uVar71;
                      auVar80 = ZEXT1632(auVar80._0_16_);
                      (*p_Var11)(&local_c90);
                      auVar177 = ZEXT3264(local_d40);
                      auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                      auVar216 = ZEXT1664(local_e30);
                      k = local_eb8;
                      pGVar69 = local_d60;
                      uVar59 = local_ea0;
                      uVar71 = local_e60;
                      ray = local_eb0;
                    }
                    auVar77 = vpcmpeqd_avx(local_d20,ZEXT816(0) << 0x40);
                    auVar94 = vpcmpeqd_avx(local_d10,ZEXT816(0) << 0x40);
                    auVar101._16_16_ = auVar94;
                    auVar101._0_16_ = auVar77;
                    auVar83._0_4_ = auVar77._0_4_ ^ auVar80._0_4_;
                    auVar83._4_4_ = auVar77._4_4_ ^ auVar80._4_4_;
                    auVar83._8_4_ = auVar77._8_4_ ^ auVar80._8_4_;
                    auVar83._12_4_ = auVar77._12_4_ ^ auVar80._12_4_;
                    auVar83._16_4_ = auVar94._0_4_ ^ auVar80._16_4_;
                    auVar83._20_4_ = auVar94._4_4_ ^ auVar80._20_4_;
                    auVar83._24_4_ = auVar94._8_4_ ^ auVar80._24_4_;
                    auVar83._28_4_ = auVar94._12_4_ ^ auVar80._28_4_;
                    auVar122._8_4_ = 0xff800000;
                    auVar122._0_8_ = 0xff800000ff800000;
                    auVar122._12_4_ = 0xff800000;
                    auVar122._16_4_ = 0xff800000;
                    auVar122._20_4_ = 0xff800000;
                    auVar122._24_4_ = 0xff800000;
                    auVar122._28_4_ = 0xff800000;
                    auVar80 = vblendvps_avx(auVar122,*(undefined1 (*) [32])(local_c90.ray + 0x100),
                                            auVar101);
                    *(undefined1 (*) [32])(local_c90.ray + 0x100) = auVar80;
                  }
                  if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar83 >> 0x7f,0) != '\0') ||
                        (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar83 >> 0xbf,0) != '\0') ||
                      (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar83[0x1f] < '\0') goto LAB_00fa7a65;
                  *(int *)(ray + k * 4 + 0x100) = auVar177._0_4_;
                  uVar59 = uVar59 ^ 1L << (uVar71 & 0x3f);
                  uVar71 = 0;
                  if (uVar59 != 0) {
                    for (; (uVar59 >> uVar71 & 1) == 0; uVar71 = uVar71 + 1) {
                    }
                  }
                }
              }
            }
          }
        }
        local_d88 = local_d88 & local_d88 - 1;
        auVar242 = ZEXT1664(local_bb0);
        auVar251 = ZEXT1664(local_bc0);
        auVar255 = ZEXT1664(local_bd0);
        auVar270 = ZEXT1664(local_be0);
        uVar71 = local_da8;
      }
      auVar177 = ZEXT1664(_local_ce0);
      auVar204 = ZEXT1664(local_bf0);
      pauVar67 = (undefined1 (*) [16])0x0;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }